

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfSampleCountChannel.cpp
# Opt level: O3

void __thiscall
Imf_3_2::SampleCountChannel::set(SampleCountChannel *this,int x,int y,uint newNumSamples)

{
  uint *oldNumSamples;
  uint *puVar1;
  ulong uVar2;
  DeepImageLevel *this_00;
  size_t *psVar3;
  size_t sVar4;
  uint *newNumSamples_00;
  size_t *newSampleListPositions;
  uint uVar5;
  ulong uVar6;
  ulong uVar7;
  uint uVar8;
  uint uVar9;
  size_t i;
  long lVar10;
  long lVar11;
  
  lVar11 = (long)(this->super_ImageChannel)._pixelsPerRow;
  oldNumSamples = this->_numSamples;
  uVar9 = this->_base[y * lVar11 + (long)x];
  lVar10 = (long)(this->_base + y * lVar11 + (long)x) - (long)oldNumSamples;
  if (uVar9 < newNumSamples) {
    i = lVar10 >> 2;
    puVar1 = this->_sampleListSizes;
    if (*(uint *)((long)puVar1 + lVar10) < newNumSamples) {
      uVar8 = 1;
      do {
        uVar5 = uVar8;
        uVar8 = uVar5 * 2;
      } while (uVar5 < newNumSamples);
      if (this->_sampleBufferSize < this->_totalSamplesOccupied + (long)(int)uVar5) {
        this->_totalNumSamples = this->_totalNumSamples + (ulong)(newNumSamples - uVar9);
        uVar2 = (this->super_ImageChannel)._numPixels;
        newNumSamples_00 = (uint *)operator_new__(-(ulong)(uVar2 >> 0x3e != 0) | uVar2 * 4);
        this->_numSamples = newNumSamples_00;
        this_00 = (DeepImageLevel *)(this->super_ImageChannel)._level;
        psVar3 = this->_sampleListPositions;
        this->_base = newNumSamples_00 +
                      (-((this_00->super_ImageLevel)._dataWindow.min.y * lVar11) -
                      (long)(this_00->super_ImageLevel)._dataWindow.min.x);
        newSampleListPositions = (size_t *)operator_new__(-(ulong)(uVar2 >> 0x3d != 0) | uVar2 * 8);
        this->_sampleListPositions = newSampleListPositions;
        this->_totalSamplesOccupied = 0;
        if (uVar2 == 0) {
          uVar6 = 0;
        }
        else {
          uVar7 = 0;
          uVar6 = 0;
          do {
            uVar9 = newNumSamples;
            if (uVar7 != i) {
              uVar9 = oldNumSamples[uVar7];
            }
            newNumSamples_00[uVar7] = uVar9;
            newSampleListPositions[uVar7] = uVar6;
            if (uVar9 == 0) {
              uVar8 = 0;
            }
            else {
              uVar5 = 1;
              do {
                uVar8 = uVar5;
                uVar5 = uVar8 * 2;
              } while (uVar8 < uVar9);
            }
            puVar1[uVar7] = uVar8;
            uVar6 = uVar6 + uVar8;
            uVar7 = uVar7 + 1;
          } while (uVar7 != uVar2);
          this->_totalSamplesOccupied = uVar6;
        }
        this->_sampleBufferSize = (uVar6 >> 1) + uVar6;
        DeepImageLevel::moveSamplesToNewBuffer
                  (this_00,oldNumSamples,newNumSamples_00,newSampleListPositions);
        if (oldNumSamples != (uint *)0x0) {
          operator_delete__(oldNumSamples);
        }
        if (psVar3 == (size_t *)0x0) {
          return;
        }
        operator_delete__(psVar3);
        return;
      }
      DeepImageLevel::moveSampleList
                ((DeepImageLevel *)(this->super_ImageChannel)._level,i,uVar9,newNumSamples,
                 this->_totalSamplesOccupied);
      sVar4 = this->_totalSamplesOccupied;
      this->_sampleListPositions[i] = sVar4;
      this->_totalSamplesOccupied = (long)(int)uVar5 + sVar4;
    }
    else {
      DeepImageLevel::setSamplesToZero
                ((DeepImageLevel *)(this->super_ImageChannel)._level,i,uVar9,newNumSamples);
    }
    this->_totalNumSamples =
         this->_totalNumSamples +
         (ulong)(newNumSamples - *(int *)((long)this->_numSamples + lVar10));
    *(uint *)((long)this->_numSamples + lVar10) = newNumSamples;
  }
  else {
    this->_totalNumSamples = this->_totalNumSamples - (ulong)(uVar9 - newNumSamples);
    *(uint *)((long)oldNumSamples + lVar10) = newNumSamples;
  }
  return;
}

Assistant:

void
SampleCountChannel::set (int x, int y, unsigned int newNumSamples)
{
    //
    // Set the number of samples for pixel (x,y) to newNumSamples.
    // Compute the position of the pixel in the the various
    // arrays that describe it.
    //

    size_t i = (_base + y * pixelsPerRow () + x) - _numSamples;

    if (newNumSamples <= _numSamples[i])
    {
        //
        // The number of samples for the pixel becomes smaller.
        // Save the new number of samples.
        //

        _totalNumSamples -= _numSamples[i] - newNumSamples;
        _numSamples[i] = newNumSamples;
        return;
    }

    if (newNumSamples <= _sampleListSizes[i])
    {
        //
        // The number of samples for the pixel becomes larger, but the new
        // number of samples still fits into the space that has been allocated
        // for the sample list.  Set the new samples at the end of the list to
        // zero.
        //

        deepLevel ().setSamplesToZero (i, _numSamples[i], newNumSamples);

        _totalNumSamples += newNumSamples - _numSamples[i];
        _numSamples[i] = newNumSamples;
        return;
    }

    int newSampleListSize = roundListSizeUp (newNumSamples);

    if (_totalSamplesOccupied + newSampleListSize <= _sampleBufferSize)
    {
        //
        // The number of samples in the pixel no longer fits into the
        // space that has been allocated for the sample list, but there
        // is space available at the end of the sample buffer.  Allocate
        // space for a new list at the end of the sample buffer, and move
        // the sample list from its old location to its new, larger place.
        //

        deepLevel ().moveSampleList (
            i, _numSamples[i], newNumSamples, _totalSamplesOccupied);

        _sampleListPositions[i] = _totalSamplesOccupied;
        _totalSamplesOccupied += newSampleListSize;
        _totalNumSamples += newNumSamples - _numSamples[i];
        _numSamples[i] = newNumSamples;
        return;
    }

    //
    // The new number of samples no longer fits into the space that has
    // been allocated for the sample list, and there is not enough room
    // at the end of the sample buffer for a new, larger sample list.
    // Allocate an entirely new sample buffer, and move all existing
    // sample lists into it.
    //

    unsigned int* oldNumSamples          = 0;
    size_t*       oldSampleListPositions = 0;

    try
    {
        _totalNumSamples += newNumSamples - _numSamples[i];

        oldNumSamples = _numSamples;
        _numSamples   = new unsigned int[numPixels ()];

        resetBasePointer ();

        oldSampleListPositions = _sampleListPositions;
        _sampleListPositions   = new size_t[numPixels ()];

        _totalSamplesOccupied = 0;

        for (size_t j = 0; j < numPixels (); ++j)
        {
            if (j == i)
                _numSamples[j] = newNumSamples;
            else
                _numSamples[j] = oldNumSamples[j];

            _sampleListPositions[j] = _totalSamplesOccupied;
            _sampleListSizes[j]     = roundListSizeUp (_numSamples[j]);
            _totalSamplesOccupied += _sampleListSizes[j];
        }

        _sampleBufferSize = roundBufferSizeUp (_totalSamplesOccupied);

        deepLevel ().moveSamplesToNewBuffer (
            oldNumSamples, _numSamples, _sampleListPositions);

        delete[] oldNumSamples;
        delete[] oldSampleListPositions;
    }
    catch (...)
    {
        delete[] oldNumSamples;
        delete[] oldSampleListPositions;

        level ().image ().resize (Box2i (V2i (0, 0), V2i (-1, -1)));
        throw;
    }
}